

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_object_detail.hpp
# Opt level: O2

bool __thiscall
chaiscript::dispatch::detail::Dynamic_Object_Function::call_match
          (Dynamic_Object_Function *this,Function_Params *vals,Type_Conversions_State *t_conversions
          )

{
  element_type *peVar1;
  bool bVar2;
  undefined1 uVar3;
  int iVar4;
  
  bVar2 = dynamic_object_typename_match(this,vals,&this->m_type_name,&this->m_ti,t_conversions);
  if (bVar2) {
    peVar1 = (this->m_func).
             super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    iVar4 = (*peVar1->_vptr_Proxy_Function_Base[3])(peVar1,vals,t_conversions);
    uVar3 = (undefined1)iVar4;
  }
  else {
    uVar3 = 0;
  }
  return (bool)uVar3;
}

Assistant:

bool call_match(const chaiscript::Function_Params &vals, const Type_Conversions_State &t_conversions) const noexcept override {
          if (dynamic_object_typename_match(vals, m_type_name, m_ti, t_conversions)) {
            return m_func->call_match(vals, t_conversions);
          } else {
            return false;
          }
        }